

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O1

void fld_mul(limb_t *res,limb_t *a,limb_t *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  
  lVar1 = *a;
  lVar2 = a[1];
  lVar3 = a[2];
  lVar22 = lVar3 * 0x13;
  lVar4 = *b;
  lVar5 = a[3];
  lVar6 = b[4];
  uVar13 = lVar6 * lVar2 * 0x13;
  uVar16 = uVar13 + lVar4 * lVar1;
  lVar7 = b[3];
  uVar20 = lVar7 * lVar22 + uVar16;
  lVar11 = lVar5 * 0x13;
  lVar8 = b[2];
  uVar24 = lVar8 * lVar11 + uVar20;
  lVar9 = a[4];
  lVar12 = lVar9 * 0x13;
  lVar10 = b[1];
  uVar14 = lVar10 * lVar12 + uVar24;
  lVar15 = SUB168(SEXT816(lVar10) * SEXT816(lVar12),8) +
           SUB168(SEXT816(lVar8) * SEXT816(lVar11),8) +
           SUB168(SEXT816(lVar7) * SEXT816(lVar22),8) +
           SUB168(SEXT816(lVar6) * SEXT816(lVar2 * 0x13),8) +
           SUB168(SEXT816(lVar4) * SEXT816(lVar1),8) + (ulong)CARRY8(uVar13,lVar4 * lVar1) +
           (ulong)CARRY8(lVar7 * lVar22,uVar16) + (ulong)CARRY8(lVar8 * lVar11,uVar20) +
           (ulong)CARRY8(lVar10 * lVar12,uVar24);
  uVar13 = lVar15 * 0x2000 | uVar14 >> 0x33;
  uVar16 = lVar6 * lVar22 + lVar4 * lVar2;
  uVar20 = uVar16 + lVar7 * lVar11;
  uVar24 = uVar20 + lVar8 * lVar12;
  uVar17 = uVar24 + lVar10 * lVar1;
  uVar18 = uVar17 + uVar13;
  lVar22 = SUB168(SEXT816(lVar6) * SEXT816(lVar22),8) + SUB168(SEXT816(lVar4) * SEXT816(lVar2),8) +
           (ulong)CARRY8(lVar6 * lVar22,lVar4 * lVar2) + SUB168(SEXT816(lVar7) * SEXT816(lVar11),8)
           + (ulong)CARRY8(uVar16,lVar7 * lVar11) + SUB168(SEXT816(lVar8) * SEXT816(lVar12),8) +
           (ulong)CARRY8(uVar20,lVar8 * lVar12) + SUB168(SEXT816(lVar10) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar24,lVar10 * lVar1) + (lVar15 >> 0x33) + (ulong)CARRY8(uVar17,uVar13);
  uVar17 = lVar22 * 0x2000 | uVar18 >> 0x33;
  uVar13 = lVar6 * lVar11 + lVar4 * lVar3;
  uVar16 = uVar13 + lVar7 * lVar12;
  uVar20 = uVar16 + lVar8 * lVar1;
  uVar24 = uVar20 + lVar10 * lVar2;
  uVar19 = uVar24 + uVar17;
  lVar22 = SUB168(SEXT816(lVar6) * SEXT816(lVar11),8) + SUB168(SEXT816(lVar4) * SEXT816(lVar3),8) +
           (ulong)CARRY8(lVar6 * lVar11,lVar4 * lVar3) + SUB168(SEXT816(lVar7) * SEXT816(lVar12),8)
           + (ulong)CARRY8(uVar13,lVar7 * lVar12) + SUB168(SEXT816(lVar8) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar16,lVar8 * lVar1) + SUB168(SEXT816(lVar10) * SEXT816(lVar2),8) +
           (ulong)CARRY8(uVar20,lVar10 * lVar2) + (lVar22 >> 0x33) + (ulong)CARRY8(uVar24,uVar17);
  uVar17 = lVar22 * 0x2000 | uVar19 >> 0x33;
  uVar13 = lVar6 * lVar12 + lVar4 * lVar5;
  uVar16 = uVar13 + lVar7 * lVar1;
  uVar20 = uVar16 + lVar8 * lVar2;
  uVar24 = uVar20 + lVar10 * lVar3;
  uVar21 = uVar24 + uVar17;
  lVar22 = SUB168(SEXT816(lVar6) * SEXT816(lVar12),8) + SUB168(SEXT816(lVar4) * SEXT816(lVar5),8) +
           (ulong)CARRY8(lVar6 * lVar12,lVar4 * lVar5) + SUB168(SEXT816(lVar7) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar13,lVar7 * lVar1) + SUB168(SEXT816(lVar8) * SEXT816(lVar2),8) +
           (ulong)CARRY8(uVar16,lVar8 * lVar2) + SUB168(SEXT816(lVar10) * SEXT816(lVar3),8) +
           (ulong)CARRY8(uVar20,lVar10 * lVar3) + (lVar22 >> 0x33) + (ulong)CARRY8(uVar24,uVar17);
  uVar23 = lVar22 * 0x2000 | uVar21 >> 0x33;
  uVar13 = lVar4 * lVar9 + lVar6 * lVar1;
  uVar16 = uVar13 + lVar7 * lVar2;
  uVar20 = uVar16 + lVar8 * lVar3;
  uVar24 = uVar20 + lVar10 * lVar5;
  uVar17 = uVar24 + uVar23;
  uVar13 = ((SUB168(SEXT816(lVar4) * SEXT816(lVar9),8) + SUB168(SEXT816(lVar6) * SEXT816(lVar1),8) +
             (ulong)CARRY8(lVar4 * lVar9,lVar6 * lVar1) + SUB168(SEXT816(lVar7) * SEXT816(lVar2),8)
             + (ulong)CARRY8(uVar13,lVar7 * lVar2) + SUB168(SEXT816(lVar8) * SEXT816(lVar3),8) +
             (ulong)CARRY8(uVar16,lVar8 * lVar3) + SUB168(SEXT816(lVar10) * SEXT816(lVar5),8) +
             (ulong)CARRY8(uVar20,lVar10 * lVar5) + (lVar22 >> 0x33) + (ulong)CARRY8(uVar24,uVar23))
            * 0x2000 | uVar17 >> 0x33) * 0x13 + (uVar14 & 0x7ffffffffffff);
  res[1] = (uVar18 & 0x7ffffffffffff) + ((long)uVar13 >> 0x33);
  *res = uVar13 & 0x7ffffffffffff;
  res[2] = uVar19 & 0x7ffffffffffff;
  res[3] = uVar21 & 0x7ffffffffffff;
  res[4] = uVar17 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_mul(fld_t res, const fld_t a, const fld_t b)
{
	limb_t a19_1, a19_2, a19_3, a19_4, tmp;
	llimb_t c[5];

	a19_1 = 19*a[1];
	a19_2 = 19*a[2];
	a19_3 = 19*a[3];
	a19_4 = 19*a[4];

	c[0] = (llimb_t)a[0]*b[0] + (llimb_t)a19_1*b[4] + (llimb_t)a19_2*b[3]
		+ (llimb_t)a19_3*b[2] + (llimb_t)a19_4*b[1];
	c[1] = (llimb_t)a[0]*b[1] + (llimb_t)a[1]*b[0] + (llimb_t)a19_2*b[4]
		+ (llimb_t)a19_3*b[3] + (llimb_t)a19_4*b[2];
	c[2] = (llimb_t)a[0]*b[2] + (llimb_t)a[1]*b[1] + (llimb_t)a[2]*b[0]
		+ (llimb_t)a19_3*b[4] + (llimb_t)a19_4*b[3];
	c[3] = (llimb_t)a[0]*b[3] + (llimb_t)a[1]*b[2] + (llimb_t)a[2]*b[1]
		+ (llimb_t)a[3]*b[0] + (llimb_t)a19_4*b[4];
	c[4] = (llimb_t)a[0]*b[4] + (llimb_t)a[1]*b[3] + (llimb_t)a[2]*b[2]
		+ (llimb_t)a[3]*b[1] + (llimb_t)a[4]*b[0];


	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}